

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directive.cpp
# Opt level: O0

void __thiscall ast::Dir_align::Dir_align(Dir_align *this,Expression *size,Location left)

{
  uint address;
  uint16_t uVar1;
  int iVar2;
  Expression *size_local;
  Dir_align *this_local;
  
  Directive::Directive(&this->super_Directive,left);
  (this->super_Directive).super_Statement._vptr_Statement = (_func_int **)&PTR__Dir_align_0017e910;
  this->size = size;
  (this->super_Directive).super_Statement.section_index =
       *(uint *)(Sections::current_section + 0x20);
  (this->super_Directive).super_Statement.section_offset =
       *(uint *)(Sections::current_section + 0x30);
  address = (this->super_Directive).super_Statement.section_offset;
  uVar1 = Expression::get_value(size);
  iVar2 = Sections::align(address,(uint)uVar1);
  (this->super_Directive).super_Statement.size_in_memory =
       iVar2 - (this->super_Directive).super_Statement.section_offset;
  Sections::increase((this->super_Directive).super_Statement.section_index,
                     (this->super_Directive).super_Statement.size_in_memory);
  return;
}

Assistant:

Dir_align::Dir_align (Expression *size, Location left) :
	Directive {left}, size {size} 
{
	section_index = Sections::current_section->number;
	section_offset = Sections::current_section->content_size;
	size_in_memory = Sections::align(section_offset, size->get_value()) - section_offset;
	Sections::increase(section_index, size_in_memory);
}